

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O0

bool __thiscall ON_WindowsBitmap::ReadCompressed(ON_WindowsBitmap *this,ON_BinaryArchive *file)

{
  ON_WindowsBITMAPINFO *pOVar1;
  size_t sVar2;
  size_t sizeof_colors;
  size_t sizeof_buffer;
  ulong uStack_60;
  int color_count;
  size_t sizeof_image;
  size_t sizeof_palette;
  uint local_48;
  bool rc;
  uint uStack_44;
  short s;
  int i;
  ON_WindowsBITMAPINFOHEADER bmiHeader;
  bool bFailedCRC;
  ON_BinaryArchive *file_local;
  ON_WindowsBitmap *this_local;
  
  unique0x10000397 = file;
  Internal_Destroy(this);
  bmiHeader.biClrUsed._3_1_ = 0;
  memset(&stack0xffffffffffffffbc,0,0x28);
  local_48 = 0;
  sizeof_palette._6_2_ = 0;
  sizeof_palette._5_1_ = ON_BinaryArchive::ReadInt(stack0xffffffffffffffe8,(ON__INT32 *)&local_48);
  if ((bool)sizeof_palette._5_1_) {
    uStack_44 = local_48;
    sizeof_palette._5_1_ = ON_BinaryArchive::ReadInt(stack0xffffffffffffffe8,(ON__INT32 *)&local_48)
    ;
    if ((bool)sizeof_palette._5_1_) {
      i = local_48;
      sizeof_palette._5_1_ =
           ON_BinaryArchive::ReadInt(stack0xffffffffffffffe8,(ON__INT32 *)&local_48);
      if ((bool)sizeof_palette._5_1_) {
        bmiHeader.biSize = local_48;
        sizeof_palette._5_1_ =
             ON_BinaryArchive::ReadShort
                       (stack0xffffffffffffffe8,(ON__INT16 *)((long)&sizeof_palette + 6));
        if ((bool)sizeof_palette._5_1_) {
          bmiHeader.biWidth._0_2_ = sizeof_palette._6_2_;
          sizeof_palette._5_1_ =
               ON_BinaryArchive::ReadShort
                         (stack0xffffffffffffffe8,(ON__INT16 *)((long)&sizeof_palette + 6));
          if ((bool)sizeof_palette._5_1_) {
            bmiHeader.biWidth._2_2_ = sizeof_palette._6_2_;
            sizeof_palette._5_1_ =
                 ON_BinaryArchive::ReadInt(stack0xffffffffffffffe8,(ON__INT32 *)&local_48);
            if ((bool)sizeof_palette._5_1_) {
              bmiHeader.biHeight = local_48;
              sizeof_palette._5_1_ =
                   ON_BinaryArchive::ReadInt(stack0xffffffffffffffe8,(ON__INT32 *)&local_48);
              if ((bool)sizeof_palette._5_1_) {
                bmiHeader.biPlanes = (undefined2)local_48;
                bmiHeader.biBitCount = local_48._2_2_;
                sizeof_palette._5_1_ =
                     ON_BinaryArchive::ReadInt(stack0xffffffffffffffe8,(ON__INT32 *)&local_48);
                if ((bool)sizeof_palette._5_1_) {
                  bmiHeader.biCompression = local_48;
                  sizeof_palette._5_1_ =
                       ON_BinaryArchive::ReadInt(stack0xffffffffffffffe8,(ON__INT32 *)&local_48);
                  if ((bool)sizeof_palette._5_1_) {
                    bmiHeader.biSizeImage = local_48;
                    sizeof_palette._5_1_ =
                         ON_BinaryArchive::ReadInt(stack0xffffffffffffffe8,(ON__INT32 *)&local_48);
                    if ((bool)sizeof_palette._5_1_) {
                      bmiHeader.biXPelsPerMeter = local_48;
                      sizeof_palette._5_1_ =
                           ON_BinaryArchive::ReadInt(stack0xffffffffffffffe8,(ON__INT32 *)&local_48)
                      ;
                      if ((bool)sizeof_palette._5_1_) {
                        bmiHeader.biYPelsPerMeter = local_48;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if ((bool)sizeof_palette._5_1_ != false) {
    uStack_44 = 0x28;
    sizeof_image = ON_WindowsBitmapHelper_SizeofPalette
                             (bmiHeader.biXPelsPerMeter,(uint)bmiHeader.biWidth._2_2_);
    uStack_60 = (ulong)(uint)bmiHeader._12_4_;
    pOVar1 = ON_WindowsBitmapHelper_AllocBMI(sizeof_image,uStack_60);
    this->m_bmi = pOVar1;
    if (this->m_bmi == (ON_WindowsBITMAPINFO *)0x0) {
      sizeof_palette._5_1_ = false;
    }
    else {
      this->m_bFreeBMI = 1;
      memcpy(this->m_bmi,&stack0xffffffffffffffbc,0x28);
      (this->m_bmi->bmiHeader).biSize = 0x28;
      sizeof_buffer._4_4_ =
           ON_WindowsBitmapHelper_PaletteColorCount
                     (bmiHeader.biXPelsPerMeter,(uint)bmiHeader.biWidth._2_2_);
      if (uStack_60 != 0) {
        this->m_bits = &this->m_bmi->bmiColors[sizeof_buffer._4_4_].rgbBlue;
      }
      sizeof_colors = 0;
      sizeof_palette._5_1_ =
           ON_BinaryArchive::ReadCompressedBufferSize(stack0xffffffffffffffe8,&sizeof_colors);
      if ((bool)sizeof_palette._5_1_) {
        sVar2 = (long)sizeof_buffer._4_4_ * 4;
        if ((sizeof_colors == sVar2) || (sizeof_colors == sVar2 + uStack_60)) {
          sizeof_palette._5_1_ =
               ON_BinaryArchive::ReadCompressedBuffer
                         (stack0xffffffffffffffe8,sizeof_colors,this->m_bmi->bmiColors,
                          (bool *)((long)&bmiHeader.biClrUsed + 3));
          if (((bool)sizeof_palette._5_1_) && ((uStack_60 != 0 && (sizeof_colors == sVar2)))) {
            sizeof_colors = 0;
            sizeof_palette._5_1_ =
                 ON_BinaryArchive::ReadCompressedBufferSize(stack0xffffffffffffffe8,&sizeof_colors);
            if ((bool)sizeof_palette._5_1_) {
              if (sizeof_colors == uStack_60) {
                sizeof_palette._5_1_ =
                     ON_BinaryArchive::ReadCompressedBuffer
                               (stack0xffffffffffffffe8,sizeof_colors,
                                this->m_bmi->bmiColors + sizeof_buffer._4_4_,
                                (bool *)((long)&bmiHeader.biClrUsed + 3));
              }
              else {
                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_bitmap.cpp"
                           ,0x3b4,"",
                           "ON_WindowsBitmap::ReadCompressed() image bits buffer size mismatch\n");
                sizeof_palette._5_1_ = false;
              }
            }
          }
        }
        else {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_bitmap.cpp"
                     ,0x3bc,"","ON_WindowsBitmap::ReadCompressed() buffer size mismatch\n");
          sizeof_palette._5_1_ = false;
        }
      }
    }
  }
  return (bool)sizeof_palette._5_1_;
}

Assistant:

bool ON_WindowsBitmap::ReadCompressed( ON_BinaryArchive& file )
{
  Internal_Destroy();

  bool bFailedCRC = false;
#if defined(ON_OS_WINDOWS_GDI)
  BITMAPINFOHEADER bmiHeader;
#else
  ON_WindowsBITMAPINFOHEADER bmiHeader;
#endif
  memset(&bmiHeader,0,sizeof(bmiHeader));
  int i;
  short s;
  bool rc;

  for(;;)
  {
    i = 0;
    s = 0;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biSize = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biWidth = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biHeight = i;
    rc = file.ReadShort(&s); if (!rc) break; bmiHeader.biPlanes = s;
    rc = file.ReadShort(&s); if (!rc) break; bmiHeader.biBitCount = s;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biCompression = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biSizeImage = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biXPelsPerMeter = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biYPelsPerMeter = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biClrUsed = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biClrImportant = i;
    break;
  }


  if ( rc ) 
  {
    bmiHeader.biSize = sizeof(bmiHeader);
    const size_t sizeof_palette = ON_WindowsBitmapHelper_SizeofPalette(bmiHeader.biClrUsed, bmiHeader.biBitCount );
    const size_t sizeof_image   = bmiHeader.biSizeImage;
    m_bmi = ON_WindowsBitmapHelper_AllocBMI(sizeof_palette,sizeof_image);
    if ( !m_bmi )
    {
      rc = false;
    }
    else 
    {
      m_bFreeBMI = 1;
      m_bmi->bmiHeader = bmiHeader;
      m_bmi->bmiHeader.biSize = sizeof(m_bmi->bmiHeader);
      const int color_count = ON_WindowsBitmapHelper_PaletteColorCount(bmiHeader.biClrUsed, bmiHeader.biBitCount );
      if ( sizeof_image > 0 )
        m_bits = (unsigned char*)&m_bmi->bmiColors[color_count];
      size_t sizeof_buffer = 0;
      rc = file.ReadCompressedBufferSize( &sizeof_buffer );
      if (rc)
      {
        const size_t sizeof_colors = color_count*sizeof(*m_bmi->bmiColors);
        if (    sizeof_buffer == sizeof_colors
             || sizeof_buffer == sizeof_colors + sizeof_image
           ) 
        {
          // palette and image bits are compressed into one or two chunks
          rc = file.ReadCompressedBuffer( sizeof_buffer, m_bmi->bmiColors, &bFailedCRC );
          if ( rc && sizeof_image > 0 && sizeof_buffer == sizeof_colors )
          {
            // 28 July 2003
            //     Added support for reading non-contiguous bitmaps
            sizeof_buffer = 0;
            rc = file.ReadCompressedBufferSize( &sizeof_buffer );
            if (rc)
            {
              if ( sizeof_buffer == sizeof_image )
              {
                // image bits are compressed into a separatechunk
                rc = file.ReadCompressedBuffer( sizeof_buffer, &m_bmi->bmiColors[color_count], &bFailedCRC );
              }
              else
              {
                ON_ERROR("ON_WindowsBitmap::ReadCompressed() image bits buffer size mismatch\n");
                rc = false;
              }
            }
          }
        }
        else
        {
          ON_ERROR("ON_WindowsBitmap::ReadCompressed() buffer size mismatch\n");
          rc = false;
        }
      }
    }
  }
  return rc;
}